

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.c
# Opt level: O3

mpc_parser_t * parse_doc_comment(void)

{
  mpc_parser_t *pmVar1;
  mpc_parser_t *pmVar2;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  
  pmVar1 = any_newline();
  pmVar1 = mpc_not(pmVar1,free);
  pmVar2 = mpc_any();
  pmVar1 = mpc_and(2,mpcf_snd,pmVar1,pmVar2,free);
  pmVar1 = mpc_many(mpcf_strfold,pmVar1);
  pmVar1 = mpc_apply(pmVar1,apply_comment_line);
  pmVar2 = mpc_oneof(" \t");
  pmVar2 = mpc_many(mpcf_all_free,pmVar2);
  pmVar3 = mpc_string("//");
  pmVar4 = any_newline();
  pmVar1 = mpc_and(4,mpcf_trd_free,pmVar2,pmVar3,pmVar1,pmVar4,free,free);
  pmVar1 = mpc_many1(mpcf_strfold,pmVar1);
  pmVar1 = mpc_tok(pmVar1);
  return pmVar1;
}

Assistant:

mpc_parser_t *parse_doc_comment()
{
    mpc_parser_t *comment_contents = mpc_apply(
        until_eol(),
        apply_comment_line);

    mpc_parser_t *comment_line = mpc_and(
        4, mpcf_trd_free,
        mpc_many(mpcf_all_free, no_newline_whitespace()), mpc_string("//"), comment_contents, any_newline(),
        free, free);

    return mpc_tok(mpc_many1(mpcf_strfold, comment_line));
}